

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.cpp
# Opt level: O3

void __thiscall
qclab::qgates::CY<std::complex<float>_>::apply
          (CY<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_24_3_f49331b9 f;
  int *local_60 [2];
  long local_50;
  anon_class_24_3_f49331b9 local_48;
  
  (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
    super_QObject<std::complex<float>_>._vptr_QObject[5])(local_60,this);
  *(ulong *)local_60[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_60[0] >> 0x20),
                offset + (int)*(undefined8 *)local_60[0]);
  iVar1 = (this->super_QControlledGate2<std::complex<float>_>).control_;
  iVar2 = (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[0xf])(this);
  local_48.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48.lambda1._M_value._4_4_ = 0xbf800000;
  if (op == Trans) {
    local_48.lambda1._M_value._4_4_ = 0x3f800000;
  }
  local_48.lambda2._M_value._4_4_ = (uint)(op != Trans) * -0x80000000 + -0x40800000;
  local_48.lambda1._M_value._0_4_ = 0;
  local_48.lambda2._M_value._0_4_ = 0;
  apply4<qclab::qgates::lambda_PauliY<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_60[0],local_60[0][1],iVar1 + offset,iVar2 + offset,
             (this->super_QControlledGate2<std::complex<float>_>).controlState_,&local_48);
  if (local_60[0] != (int *)0x0) {
    operator_delete(local_60[0],local_50 - (long)local_60[0]);
  }
  return;
}

Assistant:

void CY< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                       const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_PauliY( op , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }